

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Expressions.h
# Opt level: O3

void __thiscall ConstantExpression::ConstantExpression(ConstantExpression *this,SqObject *obj)

{
  int iVar1;
  uint value;
  string *str;
  float value_00;
  
  (this->super_Expression)._vptr_Expression = (_func_int **)&PTR_GetType_0012ba60;
  (this->m_text)._M_dataplus._M_p = (pointer)&(this->m_text).field_2;
  (this->m_text)._M_string_length = 0;
  (this->m_text).field_2._M_local_buf[0] = '\0';
  iVar1 = SqObject::GetType(obj);
  if (iVar1 == 0x5000002) {
    value = SqObject::GetInteger(obj);
    set(this,value);
  }
  else if (iVar1 == 0x5000004) {
    value_00 = SqObject::GetFloat(obj);
    set(this,value_00);
  }
  else if (iVar1 == 0x8000010) {
    str = SqObject::GetString_abi_cxx11_(obj);
    set(this,str);
  }
  else {
    this->m_isLiteral = true;
    (this->m_text)._M_string_length = 0;
    *(this->m_text)._M_dataplus._M_p = '\0';
  }
  return;
}

Assistant:

explicit ConstantExpression( const SqObject& obj )
	{
		switch(obj.GetType())
		{
			default:
			case SqObject::TypeNull:
				m_isLiteral = true;
				m_text.clear();
				break;

			case SqObject::TypeString:
				set(obj.GetString());
				break;

			case SqObject::TypeInteger:
				set(obj.GetInteger());
				break;

			case SqObject::TypeFloat:
				set(obj.GetFloat());
				break;
		}
	}